

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ForeachLoopStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForeachLoopStatementSyntax,slang::syntax::ForeachLoopStatementSyntax_const&>
          (BumpAllocator *this,ForeachLoopStatementSyntax *args)

{
  ForeachLoopStatementSyntax *pFVar1;
  ForeachLoopStatementSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pFVar1 = (ForeachLoopStatementSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::ForeachLoopStatementSyntax::ForeachLoopStatementSyntax(in_RSI,pFVar1);
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }